

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<float>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<float> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  byte bVar17;
  byte bVar18;
  undefined8 extraout_RAX;
  float *pfVar19;
  ulong uVar20;
  float *pfVar21;
  pointer ppVar22;
  pointer ppVar23;
  pointer ppVar24;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_float>
  __aurng;
  long lVar25;
  pointer ppVar26;
  ushort uVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar33;
  float fVar34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar35 [64];
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> r;
  allocator_type local_59;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_58;
  ulong local_40;
  default_cost_type<float> *local_38;
  
  local_38 = this;
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            (&local_58,(long)n,&local_59);
  ppVar24 = local_58.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVar23 = local_58.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_40 = (ulong)(uint)n;
  if (n != 0) {
    uVar20 = 0;
    pfVar1 = (local_38->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    do {
      local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar20].first = pfVar1[uVar20];
      local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar20].second = (int)uVar20;
      uVar20 = uVar20 + 1;
    } while (local_40 != uVar20);
  }
  ppVar26 = local_58.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_58.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_58.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar23,ppVar24);
    ppVar26 = local_58.
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppVar23 = local_58.
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (ppVar24 = local_58.
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar24 != ppVar26;
        ppVar24 = ppVar24 + 1) {
      fVar34 = ppVar23->first;
      fVar33 = ppVar24->first;
      if (((fVar33 != fVar34) || (ppVar22 = ppVar23, NAN(fVar33) || NAN(fVar34))) &&
         (ppVar22 = ppVar24, 8 < (long)ppVar24 - (long)ppVar23)) {
        do {
          auVar35._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar35._4_60_ = extraout_var;
          auVar16 = vfmadd213ss_fma(auVar35._0_16_,ZEXT416((uint)(fVar33 - fVar34)),
                                    ZEXT416((uint)fVar34));
          ppVar23->first = auVar16._0_4_;
          ppVar23 = ppVar23 + 1;
        } while (ppVar23 != ppVar24);
      }
      ppVar23 = ppVar22;
    }
  }
  if (8 < (long)ppVar26 - (long)ppVar23) {
    if ((long)ppVar23 -
        (long)local_58.
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      fVar34 = ppVar23->first;
      fVar33 = fVar34 + 1.0;
      if ((fVar34 == fVar33) && (!NAN(fVar34) && !NAN(fVar33))) goto LAB_0013fdff;
      if (ppVar23 != ppVar26) {
        do {
          auVar28._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar28._4_60_ = extraout_var_01;
          auVar16 = vfmadd213ss_fma(auVar28._0_16_,ZEXT416((uint)(fVar33 - fVar34)),
                                    ZEXT416((uint)fVar34));
          ppVar23->first = auVar16._0_4_;
          ppVar23 = ppVar23 + 1;
        } while (ppVar23 != ppVar26);
      }
    }
    else {
      fVar33 = linearize<long,float>
                         (0,(local_58.
                             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar23 -
                          (long)local_58.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3,ppVar23->first,
                          (long)local_58.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_58.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
      fVar34 = ppVar23->first;
      if ((fVar34 == fVar33) && (!NAN(fVar34) && !NAN(fVar33))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_0013fdff:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_58.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (ppVar23 != ppVar26) {
        do {
          auVar29._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar29._4_60_ = extraout_var_00;
          auVar16 = vfmadd213ss_fma(auVar29._0_16_,ZEXT416((uint)(fVar33 - fVar34)),
                                    ZEXT416((uint)fVar34));
          ppVar23->first = auVar16._0_4_;
          ppVar23 = ppVar23 + 1;
        } while (ppVar23 != ppVar26);
      }
    }
  }
  ppVar23 = local_58.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_58.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_58.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar23,local_58.
                       super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (n != 0) {
    uVar20 = 0;
    pfVar1 = (local_38->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    do {
      pfVar1[uVar20] =
           local_58.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar20].first;
      uVar20 = uVar20 + 1;
    } while (local_40 != uVar20);
    pfVar19 = pfVar1;
    if (n != 1) {
      auVar35 = ZEXT464((uint)*pfVar1);
      lVar25 = (long)n * 4 + -4;
      pfVar21 = pfVar1;
      do {
        pfVar21 = pfVar21 + 1;
        fVar34 = auVar35._0_4_;
        auVar16 = vmaxss_avx(ZEXT416((uint)*pfVar21),auVar35._0_16_);
        auVar35 = ZEXT1664(auVar16);
        if (fVar34 < *pfVar21) {
          pfVar19 = pfVar21;
        }
        lVar25 = lVar25 + -4;
      } while (lVar25 != 0);
    }
    if ((int)ABS(*pfVar19) - 0x800000U < 0x7f000000 && n != 0) {
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar29 = vpbroadcastd_avx512f(ZEXT416((uint)*pfVar19));
      auVar30 = vpbroadcastq_avx512f();
      uVar20 = 0;
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vporq_avx512f(auVar31,auVar35);
        auVar31 = vporq_avx512f(auVar31,auVar28);
        uVar15 = vpcmpuq_avx512f(auVar31,auVar30,2);
        bVar17 = (byte)uVar15;
        uVar15 = vpcmpuq_avx512f(auVar32,auVar30,2);
        bVar18 = (byte)uVar15;
        uVar27 = CONCAT11(bVar18,bVar17);
        pfVar19 = pfVar1 + uVar20;
        auVar31._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * (int)pfVar19[1];
        auVar31._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar19;
        auVar31._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * (int)pfVar19[2];
        auVar31._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * (int)pfVar19[3];
        auVar31._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * (int)pfVar19[4];
        auVar31._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * (int)pfVar19[5];
        auVar31._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * (int)pfVar19[6];
        auVar31._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * (int)pfVar19[7];
        auVar31._32_4_ = (uint)(bVar18 & 1) * (int)pfVar19[8];
        auVar31._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar19[9];
        auVar31._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar19[10];
        auVar31._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar19[0xb];
        auVar31._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar19[0xc];
        auVar31._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar19[0xd];
        auVar31._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar19[0xe];
        auVar31._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar19[0xf];
        auVar31 = vdivps_avx512f(auVar31,auVar29);
        pfVar19 = pfVar1 + uVar20;
        bVar2 = (bool)((byte)(uVar27 >> 1) & 1);
        bVar3 = (bool)((byte)(uVar27 >> 2) & 1);
        bVar4 = (bool)((byte)(uVar27 >> 3) & 1);
        bVar5 = (bool)((byte)(uVar27 >> 4) & 1);
        bVar6 = (bool)((byte)(uVar27 >> 5) & 1);
        bVar7 = (bool)((byte)(uVar27 >> 6) & 1);
        bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
        bVar9 = (bool)(bVar18 >> 1 & 1);
        bVar10 = (bool)(bVar18 >> 2 & 1);
        bVar11 = (bool)(bVar18 >> 3 & 1);
        bVar12 = (bool)(bVar18 >> 4 & 1);
        bVar13 = (bool)(bVar18 >> 5 & 1);
        bVar14 = (bool)(bVar18 >> 6 & 1);
        *pfVar19 = (float)((uint)(bVar17 & 1) * auVar31._0_4_ |
                          (uint)!(bool)(bVar17 & 1) * (int)*pfVar19);
        pfVar19[1] = (float)((uint)bVar2 * auVar31._4_4_ | (uint)!bVar2 * (int)pfVar19[1]);
        pfVar19[2] = (float)((uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * (int)pfVar19[2]);
        pfVar19[3] = (float)((uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * (int)pfVar19[3]);
        pfVar19[4] = (float)((uint)bVar5 * auVar31._16_4_ | (uint)!bVar5 * (int)pfVar19[4]);
        pfVar19[5] = (float)((uint)bVar6 * auVar31._20_4_ | (uint)!bVar6 * (int)pfVar19[5]);
        pfVar19[6] = (float)((uint)bVar7 * auVar31._24_4_ | (uint)!bVar7 * (int)pfVar19[6]);
        pfVar19[7] = (float)((uint)bVar8 * auVar31._28_4_ | (uint)!bVar8 * (int)pfVar19[7]);
        pfVar19[8] = (float)((uint)(bVar18 & 1) * auVar31._32_4_ |
                            (uint)!(bool)(bVar18 & 1) * (int)pfVar19[8]);
        pfVar19[9] = (float)((uint)bVar9 * auVar31._36_4_ | (uint)!bVar9 * (int)pfVar19[9]);
        pfVar19[10] = (float)((uint)bVar10 * auVar31._40_4_ | (uint)!bVar10 * (int)pfVar19[10]);
        pfVar19[0xb] = (float)((uint)bVar11 * auVar31._44_4_ | (uint)!bVar11 * (int)pfVar19[0xb]);
        pfVar19[0xc] = (float)((uint)bVar12 * auVar31._48_4_ | (uint)!bVar12 * (int)pfVar19[0xc]);
        pfVar19[0xd] = (float)((uint)bVar13 * auVar31._52_4_ | (uint)!bVar13 * (int)pfVar19[0xd]);
        pfVar19[0xe] = (float)((uint)bVar14 * auVar31._56_4_ | (uint)!bVar14 * (int)pfVar19[0xe]);
        pfVar19[0xf] = (float)((uint)(bVar18 >> 7) * auVar31._60_4_ |
                              (uint)!(bool)(bVar18 >> 7) * (int)pfVar19[0xf]);
        uVar20 = uVar20 + 0x10;
      } while ((local_40 + 0xf & 0xfffffffffffffff0) != uVar20);
    }
  }
  if (local_58.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }